

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_node * nbt_find_by_path(nbt_node *tree,char *path)

{
  int iVar1;
  size_t len;
  nbt_node *pnVar2;
  nbt_list *local_58;
  nbt_node *r;
  nbt_list *elem;
  nbt_list *list;
  list_head *pos;
  _Bool names_match;
  size_t e;
  char *path_local;
  nbt_node *tree_local;
  
  if (tree == (nbt_node *)0x0) {
    __assert_fail("tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x1c8,"nbt_node *nbt_find_by_path(nbt_node *, const char *)");
  }
  if (path != (char *)0x0) {
    len = index_of(path,'.');
    iVar1 = partial_strcmp(path,len,tree->name);
    if (iVar1 == 0) {
      tree_local = tree;
      if (path[len] != '\0') {
        if ((tree->type == TAG_LIST) || (tree->type == TAG_COMPOUND)) {
          if (tree->type == TAG_LIST) {
            local_58 = (tree->payload).tag_list;
          }
          else {
            local_58 = (tree->payload).tag_list;
          }
          for (list = (nbt_list *)(local_58->entry).flink; list != (nbt_list *)&local_58->entry;
              list = (nbt_list *)(list->entry).blink) {
            pnVar2 = nbt_find_by_path((nbt_node *)list[-1].entry.flink,path + len + 1);
            if (pnVar2 != (nbt_node *)0x0) {
              return pnVar2;
            }
          }
          tree_local = (nbt_node *)0x0;
        }
        else {
          tree_local = (nbt_node *)0x0;
        }
      }
    }
    else {
      tree_local = (nbt_node *)0x0;
    }
    return tree_local;
  }
  __assert_fail("path",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                0x1c9,"nbt_node *nbt_find_by_path(nbt_node *, const char *)");
}

Assistant:

nbt_node* nbt_find_by_path(nbt_node* tree, const char* path)
{
    assert(tree);
    assert(path);

    /* The end of the "current_name" piece. */
    size_t e = index_of(path, '.');

    bool names_match = partial_strcmp(path, e, tree->name) == 0;

    /* Names don't match. These aren't the droids you're looking for. */
    if(!names_match)                                         return NULL;

    /* We're a leaf node, and the names match. Wooo found it. */
    if(path[e] == '\0')                                     return tree;

    /*
     * Initial names match, but the string isn't at the end. We're expecting a
     * list, but haven't hit one.
     */
    if(tree->type != TAG_LIST && tree->type != TAG_COMPOUND) return NULL;

    /* At this point, the inital names match, and we're not at a leaf node. */

    struct list_head* pos;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* elem = list_entry(pos, struct nbt_list, entry);
        nbt_node* r;

        if((r = nbt_find_by_path(elem->data, path + e + 1)) != NULL)
            return r;
    }

    /* Wasn't found in the list (or the current node isn't a list). Give up. */
    return NULL;
}